

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::convert_bspline_to_bezier(Ref<embree::SceneGraph::Node> *node)

{
  long *plVar1;
  Node *pNVar2;
  size_type sVar3;
  reference pvVar4;
  long *in_RSI;
  Node *in_RDI;
  Ref<embree::SceneGraph::HairSetNode> hmesh;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> groupNode;
  Ref<embree::SceneGraph::MultiTransformNode> xfmNode_1;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  long *local_318;
  HairSetNode *in_stack_fffffffffffffd08;
  long *local_2c0;
  long *local_278;
  Ref<embree::SceneGraph::Node> *local_230;
  long *local_1f8;
  ulong local_1f0;
  long *local_1d8;
  long *local_1c0;
  
  if (*in_RSI == 0) {
    local_230 = (Ref<embree::SceneGraph::Node> *)0x0;
  }
  else {
    local_230 = (Ref<embree::SceneGraph::Node> *)
                __dynamic_cast(*in_RSI,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (local_230 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (**(code **)&local_230->ptr->fileName)();
  }
  if (local_230 == (Ref<embree::SceneGraph::Node> *)0x0) {
    if (*in_RSI == 0) {
      local_278 = (long *)0x0;
    }
    else {
      local_278 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
    }
    if (local_278 == (long *)0x0) {
      if (*in_RSI == 0) {
        local_2c0 = (long *)0x0;
      }
      else {
        local_2c0 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      if (local_2c0 == (long *)0x0) {
        if (*in_RSI == 0) {
          local_318 = (long *)0x0;
        }
        else {
          local_318 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&HairSetNode::typeinfo,0);
        }
        if (local_318 != (long *)0x0) {
          (**(code **)(*local_318 + 0x10))();
          HairSetNode::convert_bspline_to_bezier(in_stack_fffffffffffffd08);
          (**(code **)(*local_318 + 0x18))();
        }
      }
      else {
        (**(code **)(*local_2c0 + 0x10))();
        for (local_1f0 = 0;
            sVar3 = std::
                    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                    ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                            *)(local_2c0 + 0xd)), local_1f0 < sVar3; local_1f0 = local_1f0 + 1) {
          pvVar4 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_2c0 + 0xd),local_1f0);
          pNVar2 = pvVar4->ptr;
          if (pNVar2 != (Node *)0x0) {
            (*(pNVar2->super_RefCount)._vptr_RefCount[2])();
          }
          convert_bspline_to_bezier(local_230);
          if (local_1f8 != (long *)0x0) {
            (**(code **)(*local_1f8 + 0x18))();
          }
          if (pNVar2 != (Node *)0x0) {
            (*(pNVar2->super_RefCount)._vptr_RefCount[3])();
          }
        }
      }
      if (local_2c0 != (long *)0x0) {
        (**(code **)(*local_2c0 + 0x18))();
      }
    }
    else {
      (**(code **)(*local_278 + 0x10))();
      plVar1 = (long *)local_278[0x10];
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x10))();
      }
      convert_bspline_to_bezier(local_230);
      if (local_1d8 != (long *)0x0) {
        (**(code **)(*local_1d8 + 0x18))();
      }
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x18))();
      }
    }
    if (local_278 != (long *)0x0) {
      (**(code **)(*local_278 + 0x18))();
    }
  }
  else {
    pNVar2 = local_230[0x13].ptr;
    if (pNVar2 != (Node *)0x0) {
      (*(pNVar2->super_RefCount)._vptr_RefCount[2])();
    }
    convert_bspline_to_bezier(local_230);
    if (local_1c0 != (long *)0x0) {
      (**(code **)(*local_1c0 + 0x18))();
    }
    if (pNVar2 != (Node *)0x0) {
      (*(pNVar2->super_RefCount)._vptr_RefCount[3])();
    }
  }
  if (local_230 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (*(code *)(local_230->ptr->fileName)._M_string_length)();
  }
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)*in_RSI;
  *in_RSI = 0;
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_bspline_to_bezier(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      convert_bspline_to_bezier(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      convert_bspline_to_bezier(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        convert_bspline_to_bezier(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::HairSetNode> hmesh = node.dynamicCast<SceneGraph::HairSetNode>()) {
      hmesh->convert_bspline_to_bezier();
    }
    return node;
  }